

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form2_Threshold(ThresholdForm2 Threshold)

{
  uchar uVar1;
  byte bVar2;
  reference this;
  reference pvVar3;
  uint8_t value;
  code *in_RDI;
  Image *in_stack_00000010;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000018;
  uint8_t threshold;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 uVar4;
  undefined2 in_stack_ffffffffffffff74;
  uint8_t in_stack_ffffffffffffff76;
  uint8_t in_stack_ffffffffffffff77;
  undefined8 in_stack_ffffffffffffff78;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *this_00;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff80;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  code *local_8;
  
  local_8 = in_RDI;
  Unit_Test::intensityArray((uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff80,(uint32_t)((ulong)in_stack_ffffffffffffff78 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff78,in_stack_ffffffffffffff77,in_stack_ffffffffffffff76
            );
  Test_Helper::uniformImages(in_stack_00000018,in_stack_00000010);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e4a17);
  uVar1 = Test_Helper::randomValue<unsigned_char>(0x1e4a21);
  this_00 = &local_38;
  this = std::
         vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
         ::operator[](this_00,0);
  pvVar3 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this_00,1);
  (*local_8)(this,pvVar3,uVar1);
  pvVar3 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](&local_38,1);
  value = (uint8_t)((ulong)pvVar3 >> 0x38);
  uVar4 = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
  bVar2 = Unit_Test::verifyImage
                    ((Image *)CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT24(in_stack_ffffffffffffff74,uVar4))),value);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)this);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  return (bool)(bVar2 & 1);
}

Assistant:

bool form2_Threshold(ThresholdForm2 Threshold)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        std::vector < PenguinV_Image::Image > input = uniformImages( intensity );

        const uint8_t threshold = randomValue <uint8_t>( 255 );

        Threshold( input[0], input[1], threshold );

        return verifyImage( input[1], intensity[0] < threshold ? 0 : 255 );
    }